

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O1

void __thiscall sjtu::trainType::display(trainType *this,timeType *date)

{
  int day_id;
  int iVar1;
  undefined8 in_RAX;
  long *plVar2;
  size_t sVar3;
  ostream *poVar4;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  day_id = timeType::dateminus(date,this->saleDate);
  if (-1 < day_id) {
    iVar1 = timeType::dateminus(this->saleDate + 1,this->saleDate);
    if (day_id <= iVar1) {
      sVar3 = strlen(this->trainID);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,this->trainID,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      uStack_28 = CONCAT17(this->type,(undefined7)uStack_28);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_28 + 7),1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      display_single(this,day_id,date,0,this->stationNum);
      return;
    }
  }
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,-1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void display(timeType date)
		{
			int day_id = timeType::dateminus(date , saleDate[0]);
			if (day_id < 0 || day_id > timeType::dateminus(saleDate[1] , saleDate[0])) std::cout << -1 << std::endl;
			else
			{
				std::cout << trainID << " " << type << std::endl;
				display_single(day_id , date , 0 , stationNum);
			}
		}